

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.h
# Opt level: O0

string * __thiscall
jaegertracing::net::URI::authority_abi_cxx11_(string *__return_storage_ptr__,URI *this)

{
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  URI *local_18;
  URI *this_local;
  
  local_18 = this;
  this_local = (URI *)__return_storage_ptr__;
  if (this->_port == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_host);
  }
  else {
    std::operator+(&local_38,&this->_host,':');
    std::__cxx11::to_string(&local_58,this->_port);
    std::operator+(__return_storage_ptr__,&local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string authority() const
    {
        if (_port != 0) {
            return _host + ':' + std::to_string(_port);
        }
        return _host;
    }